

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

void sq_newarray(HSQUIRRELVM v,SQInteger size)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectValue this;
  SQObjectPtr local_30;
  
  ss = v->_sharedstate;
  this.pUserPointer = sq_vm_malloc(ss->_alloc_ctx,0x48);
  SQArray::SQArray(this.pArray,ss,size);
  local_30.super_SQObject._type = OT_ARRAY;
  local_30.super_SQObject._flags = '\0';
  pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_30.super_SQObject._unVal.pUserPointer = this.pUserPointer;
  SQVM::Push(v,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return;
}

Assistant:

void sq_newarray(HSQUIRRELVM v,SQInteger size)
{
    v->Push(SQArray::Create(_ss(v), size));
}